

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

void __thiscall
sf::priv::WindowImplX11::setIcon(WindowImplX11 *this,uint width,uint height,Uint8 *pixels)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  WindowImplX11 *pWVar6;
  void *pvVar7;
  Pixmap PVar8;
  Uint8 *pUVar9;
  undefined8 *puVar10;
  Atom AVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  Uint8 *pUVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  undefined1 auVar24 [16];
  allocator_type local_121;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  WindowImplX11 *local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> icccmIconPixels;
  string local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> maskPixels;
  XGCValues values;
  ulong uVar23;
  
  uVar14 = (ulong)height;
  uVar21 = (ulong)width;
  uVar22 = height * width;
  uVar23 = (ulong)uVar22;
  pvVar7 = malloc((ulong)(uVar22 * 4));
  if (uVar22 != 0) {
    uVar13 = 0;
    do {
      uVar1 = *(undefined4 *)(pixels + uVar13 * 4);
      auVar24._8_8_ = 0;
      auVar24._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),
                                           CONCAT12((char)((uint)uVar1 >> 8),(short)uVar1)) >> 0x10)
                           ,(short)uVar1) & 0xffff00ff00ff00ff;
      auVar24 = pshuflw(auVar24,auVar24,0xc6);
      sVar2 = auVar24._0_2_;
      sVar3 = auVar24._2_2_;
      sVar4 = auVar24._4_2_;
      sVar5 = auVar24._6_2_;
      *(uint *)((long)pvVar7 + uVar13 * 4) =
           CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar24[6] - (0xff < sVar5),
                    CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar24[4] - (0xff < sVar4),
                             CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar24[2] - (0xff < sVar3),
                                      (0 < sVar2) * (sVar2 < 0x100) * auVar24[0] - (0xff < sVar2))))
      ;
      uVar13 = uVar13 + 1;
    } while (uVar23 != uVar13);
  }
  lVar18 = *(long *)(this->m_display + 0xe8);
  lVar15 = (long)this->m_screen * 0x80;
  local_120 = XCreateImage(this->m_display,*(undefined8 *)(lVar18 + 0x40 + lVar15),
                           *(undefined4 *)(lVar18 + 0x38 + lVar15),2,0,pvVar7,uVar21,uVar14,0x20,0);
  if (local_120 != 0) {
    if (this->m_iconPixmap != 0) {
      XFreePixmap(this->m_display);
    }
    if (this->m_iconMaskPixmap != 0) {
      XFreePixmap(this->m_display);
    }
    PVar8 = XCreatePixmap(this->m_display,
                          *(undefined8 *)
                           (*(long *)(this->m_display + 0xe8) + 0x10 + (long)this->m_screen * 0x80),
                          uVar21,uVar14);
    this->m_iconPixmap = PVar8;
    local_118 = XCreateGC(this->m_display,PVar8,0,&values);
    uVar13 = local_120;
    XPutImage(this->m_display,this->m_iconPixmap,local_118,local_120,0,0,0,0,uVar21,uVar14);
    local_108 = this;
    XFreeGC(this->m_display,local_118);
    (**(code **)(uVar13 + 0x60))(uVar13);
    uVar13 = (ulong)(width + 7 >> 3);
    local_e8._M_dataplus._M_p = local_e8._M_dataplus._M_p & 0xffffffffffffff00;
    local_120 = uVar14;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&maskPixels,uVar13 * uVar14,(value_type_conflict5 *)&local_e8,
               (allocator_type *)&icccmIconPixels);
    pWVar6 = local_108;
    uVar16 = (ulong)width;
    if (height != 0) {
      pUVar9 = pixels + 3;
      uVar17 = 0;
      do {
        if (7 < width + 7) {
          lVar18 = 0;
          uVar20 = 0;
          pUVar19 = pUVar9;
          do {
            lVar15 = 0;
            do {
              if ((ulong)(lVar18 + lVar15) < uVar16) {
                maskPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start[uVar17 * uVar13 + uVar20] =
                     maskPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar17 * uVar13 + uVar20] |
                     (pUVar19[lVar15 * 4] != '\0') << ((byte)lVar15 & 0x1f);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != 8);
            uVar20 = uVar20 + 1;
            pUVar19 = pUVar19 + 0x20;
            lVar18 = lVar18 + 8;
          } while (uVar20 != uVar13);
        }
        uVar17 = uVar17 + 1;
        pUVar9 = pUVar9 + uVar16 * 4;
      } while (uVar17 != local_120);
    }
    local_118 = uVar14;
    local_110 = uVar21;
    PVar8 = XCreatePixmapFromBitmapData
                      (local_108->m_display,local_108->m_window,
                       maskPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,uVar21,uVar14,1,0,1);
    pWVar6->m_iconMaskPixmap = PVar8;
    puVar10 = (undefined8 *)XAllocWMHints();
    *puVar10 = 0x24;
    puVar10[2] = pWVar6->m_iconPixmap;
    puVar10[5] = pWVar6->m_iconMaskPixmap;
    XSetWMHints(pWVar6->m_display,pWVar6->m_window,puVar10);
    XFree(puVar10);
    local_e8._M_dataplus._M_p = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&icccmIconPixels,(ulong)(uVar22 + 2),(value_type_conflict3 *)&local_e8,&local_121);
    *icccmIconPixels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = uVar16;
    icccmIconPixels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[1] = local_120;
    if (uVar23 != 0) {
      uVar14 = 0;
      do {
        icccmIconPixels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar14 + 2] =
             (long)CONCAT13(pixels[uVar14 * 4 + 3],
                            CONCAT12(pixels[uVar14 * 4],
                                     *(ushort *)(pixels + uVar14 * 4 + 1) << 8 |
                                     *(ushort *)(pixels + uVar14 * 4 + 1) >> 8));
        uVar14 = uVar14 + 1;
      } while (uVar23 != uVar14);
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"_NET_WM_ICON","");
    AVar11 = getAtom(&local_e8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    XChangeProperty(pWVar6->m_display,pWVar6->m_window,AVar11,6,0x20,0,
                    icccmIconPixels.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,(ulong)(uVar22 + 2));
    XFlush(pWVar6->m_display);
    if (icccmIconPixels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(icccmIconPixels.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (maskPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(maskPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  poVar12 = err();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"Failed to set the window\'s icon",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  return;
}

Assistant:

void WindowImplX11::setIcon(unsigned int width, unsigned int height, const Uint8* pixels)
{
    // X11 wants BGRA pixels: swap red and blue channels
    // Note: this memory will be freed by XDestroyImage
    Uint8* iconPixels = static_cast<Uint8*>(std::malloc(width * height * 4));
    for (std::size_t i = 0; i < width * height; ++i)
    {
        iconPixels[i * 4 + 0] = pixels[i * 4 + 2];
        iconPixels[i * 4 + 1] = pixels[i * 4 + 1];
        iconPixels[i * 4 + 2] = pixels[i * 4 + 0];
        iconPixels[i * 4 + 3] = pixels[i * 4 + 3];
    }

    // Create the icon pixmap
    Visual*      defVisual = DefaultVisual(m_display, m_screen);
    unsigned int defDepth  = static_cast<unsigned int>(DefaultDepth(m_display, m_screen));
    XImage* iconImage = XCreateImage(m_display, defVisual, defDepth, ZPixmap, 0, reinterpret_cast<char*>(iconPixels), width, height, 32, 0);
    if (!iconImage)
    {
        err() << "Failed to set the window's icon" << std::endl;
        return;
    }

    if (m_iconPixmap)
        XFreePixmap(m_display, m_iconPixmap);

    if (m_iconMaskPixmap)
        XFreePixmap(m_display, m_iconMaskPixmap);

    m_iconPixmap = XCreatePixmap(m_display, RootWindow(m_display, m_screen), width, height, defDepth);
    XGCValues values;
    GC iconGC = XCreateGC(m_display, m_iconPixmap, 0, &values);
    XPutImage(m_display, m_iconPixmap, iconGC, iconImage, 0, 0, 0, 0, width, height);
    XFreeGC(m_display, iconGC);
    XDestroyImage(iconImage);

    // Create the mask pixmap (must have 1 bit depth)
    std::size_t pitch = (width + 7) / 8;
    std::vector<Uint8> maskPixels(pitch * height, 0);
    for (std::size_t j = 0; j < height; ++j)
    {
        for (std::size_t i = 0; i < pitch; ++i)
        {
            for (std::size_t k = 0; k < 8; ++k)
            {
                if (i * 8 + k < width)
                {
                    Uint8 opacity = (pixels[(i * 8 + k + j * width) * 4 + 3] > 0) ? 1 : 0;
                    maskPixels[i + j * pitch] |= static_cast<Uint8>(opacity << k);
                }
            }
        }
    }
    m_iconMaskPixmap = XCreatePixmapFromBitmapData(m_display, m_window, reinterpret_cast<char*>(&maskPixels[0]), width, height, 1, 0, 1);

    // Send our new icon to the window through the WMHints
    XWMHints* hints = XAllocWMHints();
    hints->flags       = IconPixmapHint | IconMaskHint;
    hints->icon_pixmap = m_iconPixmap;
    hints->icon_mask   = m_iconMaskPixmap;
    XSetWMHints(m_display, m_window, hints);
    XFree(hints);

    // ICCCM wants BGRA pixels: swap red and blue channels
    // ICCCM also wants the first 2 unsigned 32-bit values to be width and height
    std::vector<unsigned long> icccmIconPixels(2 + width * height, 0);
    unsigned long* ptr = &icccmIconPixels[0];

    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wnull-dereference" // False positive.
    *ptr++ = width;
    *ptr++ = height;
    #pragma GCC diagnostic pop

    for (std::size_t i = 0; i < width * height; ++i)
    {
        *ptr++ = static_cast<unsigned long>((pixels[i * 4 + 2] << 0 ) |
                                            (pixels[i * 4 + 1] << 8 ) |
                                            (pixels[i * 4 + 0] << 16) |
                                            (pixels[i * 4 + 3] << 24));
    }

    Atom netWmIcon = getAtom("_NET_WM_ICON");

    XChangeProperty(m_display,
                    m_window,
                    netWmIcon,
                    XA_CARDINAL,
                    32,
                    PropModeReplace,
                    reinterpret_cast<const unsigned char*>(&icccmIconPixels[0]),
                    static_cast<int>(2 + width * height));

    XFlush(m_display);
}